

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  byte bVar1;
  bool bVar2;
  stbtt__buf sVar3;
  bool bVar4;
  stbtt_fontinfo *psVar5;
  stbtt_uint32 sVar6;
  int iVar7;
  stbtt_uint32 sVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float dx2;
  float dy3;
  float fVar20;
  float fVar21;
  stbtt__buf sVar22;
  stbtt__buf sVar23;
  stbtt__buf local_258;
  float local_240;
  int local_23c;
  stbtt__buf local_238;
  ulong local_228;
  ulong local_220;
  undefined1 local_218 [8];
  undefined4 uStack_210;
  undefined4 uStack_20c;
  float local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float afStack_1d8 [2];
  stbtt_fontinfo *local_1d0;
  float s [48];
  stbtt__buf subr_stack [10];
  
  sVar22 = info->subrs;
  local_238 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar14 = local_238._8_8_;
  local_1d0 = info;
  uVar11 = uVar14 >> 0x20;
  bVar2 = false;
  uVar15 = 0;
  local_228 = 0;
  local_220 = 0;
  bVar4 = true;
LAB_0015fca4:
  fVar18 = s[10];
  fVar19 = s[1];
  iVar17 = (int)uVar14;
  iVar16 = (int)uVar11;
  if (iVar16 <= iVar17) {
LAB_001607da:
    return 0;
  }
  lVar9 = (long)iVar17 + 1;
  iVar7 = (int)lVar9;
  local_238.cursor = iVar7;
  bVar1 = local_238.data[iVar17];
  uVar13 = (uint)uVar15;
  switch(bVar1) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    local_220 = (ulong)(uint)((int)local_220 + (int)uVar13 / 2);
    break;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_0015fce3_caseD_2:
    if (bVar1 < 0x20) {
      return 0;
    }
    if (bVar1 == 0xff) goto LAB_0015fdd6;
  case 0x1c:
    if (-1 < iVar17) {
      iVar16 = iVar17;
    }
    local_238.cursor = iVar16;
    sVar6 = stbtt__cff_int(&local_238);
    fVar18 = (float)(int)(short)sVar6;
LAB_0015fdef:
    if (0x2f < (int)uVar13) {
      return 0;
    }
    uVar15 = (ulong)(uVar13 + 1);
    s[(int)uVar13] = fVar18;
    goto LAB_001601d7;
  case 4:
    if ((int)uVar13 < 1) {
      return 0;
    }
    fVar19 = s[uVar13 - 1];
    fVar18 = 0.0;
    goto LAB_0016010b;
  case 5:
    if ((int)uVar13 < 2) {
      return 0;
    }
    for (uVar11 = 1; uVar11 < uVar15; uVar11 = uVar11 + 2) {
      stbtt__csctx_rline_to(c,s[uVar11 - 1],s[uVar11]);
    }
    break;
  case 6:
    iVar16 = 0;
    if ((int)uVar13 < 1) {
      return 0;
    }
    for (; iVar16 < (int)uVar13; iVar16 = iVar16 + 1) {
      stbtt__csctx_rline_to(c,s[iVar16],0.0);
      iVar16 = iVar16 + 1;
LAB_001607b2:
      if ((int)uVar13 <= iVar16) break;
      stbtt__csctx_rline_to(c,0.0,s[iVar16]);
    }
    break;
  case 7:
    iVar16 = 0;
    if (0 < (int)uVar13) goto LAB_001607b2;
    return 0;
  case 8:
    if ((int)uVar13 < 6) {
      return 0;
    }
    for (uVar11 = 5; uVar11 < uVar15; uVar11 = uVar11 + 6) {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar11 - 1],afStack_1d8[uVar11],afStack_1d8[uVar11 + 1],s[uVar11 - 2]
                 ,s[uVar11 - 1],s[uVar11]);
    }
    break;
  case 10:
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = true;
      if ((local_1d0->fdselect).size != 0) {
        local_258.data = (info->fdselect).data;
        lVar9._0_4_ = (info->fdselect).cursor;
        lVar9._4_4_ = (info->fdselect).size;
        uVar11 = 0;
        if (lVar9 < 0) {
          uVar11 = (ulong)(uint)lVar9._4_4_;
        }
        iVar16 = (int)uVar11;
        local_258.cursor = (undefined4)lVar9;
        local_258.size = lVar9._4_4_;
        local_23c = glyph_index;
        if ((int)lVar9._4_4_ < 1) {
LAB_0016024c:
          uVar10 = iVar16 + glyph_index;
          uVar12 = uVar10;
          if ((int)lVar9._4_4_ < (int)uVar10) {
            uVar12 = lVar9._4_4_;
          }
          if ((int)uVar10 < 0) {
            uVar12 = lVar9._4_4_;
          }
          uVar10 = 0;
          if ((int)uVar12 < (int)lVar9._4_4_) {
            uVar10 = (uint)local_258.data[(int)uVar12];
          }
        }
        else {
          local_258.cursor = 1;
          if (local_258.data[uVar11] == '\x03') {
            sVar8 = stbtt__buf_get(&local_258,2);
            sVar6 = stbtt__buf_get(&local_258,2);
            if ((int)sVar8 < 1) {
              sVar8 = 0;
            }
            iVar16 = sVar8 + 1;
            do {
              iVar16 = iVar16 + -1;
              if (iVar16 == 0) {
                uVar10 = 0xffffffff;
                break;
              }
              lVar9 = (long)local_258.cursor;
              uVar10 = 0;
              if (local_258.cursor < local_258.size) {
                local_258.cursor = local_258.cursor + 1;
                uVar10 = (uint)local_258.data[lVar9];
              }
              sVar8 = stbtt__buf_get(&local_258,2);
              bVar2 = local_23c < (int)sVar6;
              sVar6 = sVar8;
            } while ((int)sVar8 <= local_23c || bVar2);
          }
          else {
            iVar16 = 1;
            uVar10 = 0xffffffff;
            if (local_258.data[uVar11] == '\0') goto LAB_0016024c;
          }
        }
        psVar5 = local_1d0;
        sVar22 = stbtt__cff_index_get(local_1d0->fontdicts,uVar10);
        sVar22 = stbtt__get_subrs(psVar5->cff,sVar22);
        bVar2 = true;
        glyph_index = local_23c;
      }
    }
  case 0x1d:
    sVar23 = local_238;
    if ((int)uVar13 < 1) {
      return 0;
    }
    iVar16 = (int)local_228;
    if (9 < iVar16) {
      return 0;
    }
    uVar15 = (ulong)(uVar13 - 1);
    fVar18 = s[uVar15];
    subr_stack[iVar16].data = local_238.data;
    subr_stack[iVar16].cursor = local_238.cursor;
    subr_stack[iVar16].size = local_238.size;
    sVar3 = sVar22;
    if (bVar1 != 10) {
      sVar3 = local_1d0->gsubrs;
    }
    local_258.data = sVar3.data;
    local_258.size = sVar3.size;
    local_258.cursor = local_258.size >> 0x1f & local_258.size;
    local_238 = sVar23;
    sVar6 = stbtt__buf_get(&local_258,2);
    uVar13 = (uint)(0x4d7 < (int)sVar6) << 10 | 0x6b;
    if (0x846b < (int)sVar6) {
      uVar13 = 0x8000;
    }
    iVar16 = uVar13 + (int)fVar18;
    sVar23 = (stbtt__buf)ZEXT816(0);
    if (iVar16 < (int)sVar6 && -1 < iVar16) {
      sVar23.cursor = local_258.cursor;
      sVar23.data = local_258.data;
      sVar23.size = local_258.size;
      sVar23 = stbtt__cff_index_get(sVar23,iVar16);
    }
    if (sVar23._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_228 = (ulong)((int)local_228 + 1);
    local_238.size = sVar23.size;
    local_238.data = sVar23.data;
    local_238.cursor = 0;
    goto LAB_001601d7;
  case 0xb:
    if ((int)local_228 < 1) {
      return 0;
    }
    local_228 = (ulong)((int)local_228 - 1);
    local_238.data._4_4_ = *(undefined4 *)((long)&subr_stack[local_228].data + 4);
    local_238.data._0_4_ = *(undefined4 *)&subr_stack[local_228].data;
    local_238.cursor = subr_stack[local_228].cursor;
    local_238.size = subr_stack[local_228].size;
    goto LAB_001601d7;
  case 0xc:
    if (iVar16 <= iVar7) {
      return 0;
    }
    local_238.cursor = iVar17 + 2;
    switch(local_238.data[lVar9]) {
    case '\"':
      if ((int)uVar13 < 7) {
        return 0;
      }
      _local_218 = ZEXT416((uint)s[2]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[4]);
      local_208 = s[5];
      local_1e8 = CONCAT44(local_1e8._4_4_,s[6]);
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar21 = -(float)local_218._0_4_;
      fVar20 = 0.0;
      dy3 = 0.0;
      fVar18 = (float)local_1e8;
      fVar19 = (float)local_1f8;
      dx2 = local_208;
      break;
    case '#':
      if ((int)uVar13 < 0xd) {
        return 0;
      }
      local_1e8 = CONCAT44(local_1e8._4_4_,s[6]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[7]);
      local_208 = s[8];
      local_218._0_4_ = s[9];
      local_240 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar19 = (float)local_1e8;
      fVar20 = (float)local_1f8;
      fVar21 = (float)local_218._0_4_;
      dy3 = local_240;
      dx2 = local_208;
      break;
    case '$':
      if ((int)uVar13 < 9) {
        return 0;
      }
      local_240 = s[3];
      local_1e8 = CONCAT44(local_1e8._4_4_,s[5]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[6]);
      local_218._0_4_ = s[7];
      local_208 = s[8];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      dy3 = -(fVar19 + local_240 + (float)local_218._0_4_);
      fVar20 = 0.0;
      fVar19 = (float)local_1e8;
      fVar21 = (float)local_218._0_4_;
      dx2 = (float)local_1f8;
      fVar18 = local_208;
      break;
    case '%':
      if ((int)uVar13 < 0xb) {
        return 0;
      }
      local_1f8 = CONCAT44(s[7],s[6]);
      local_1e8 = CONCAT44(s[9],s[8]);
      uStack_1f0 = 0;
      uStack_1e0 = 0;
      fVar18 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar19 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar20 = ABS(fVar18);
      fVar21 = ABS(fVar19);
      local_218._4_4_ = 0.0;
      uStack_210 = 0;
      uStack_20c = 0;
      local_218._0_4_ = s[10];
      if (fVar20 <= fVar21) {
        uStack_210 = 0x80000000;
        uStack_20c = 0x80000000;
        local_218._0_4_ = -fVar18;
        local_218._4_4_ = -fVar19;
      }
      uVar13 = -(uint)(fVar21 < fVar20);
      uStack_204 = (uint)-fVar19 & (uint)fVar21;
      uStack_200 = (uint)-fVar19 & (uint)fVar21;
      uStack_1fc = (uint)-fVar19 & (uint)fVar21;
      local_208 = (float)(~uVar13 & (uint)s[10] | (uint)-fVar19 & uVar13);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar19 = (float)local_1f8;
      fVar20 = local_1f8._4_4_;
      fVar21 = local_1e8._4_4_;
      dy3 = local_208;
      dx2 = (float)local_1e8;
      fVar18 = (float)local_218._0_4_;
      break;
    default:
      goto LAB_001607da;
    }
    goto LAB_00160175;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar4) {
      local_220 = (ulong)(uint)((int)local_220 + (int)uVar13 / 2);
    }
    iVar7 = ((int)local_220 + 7) / 8 + iVar7;
    local_238.cursor = iVar7;
    if (iVar16 < iVar7) {
      local_238.cursor = iVar16;
    }
    if (iVar7 < 0) {
      local_238.cursor = iVar16;
    }
    goto LAB_001601cc;
  case 0x15:
    if ((int)uVar13 < 2) {
      return 0;
    }
    fVar18 = s[uVar13 - 2];
    fVar19 = s[uVar13 - 1];
    goto LAB_0016010b;
  case 0x16:
    if ((int)uVar13 < 1) {
      return 0;
    }
    fVar18 = s[uVar13 - 1];
    fVar19 = 0.0;
LAB_0016010b:
    stbtt__csctx_rmove_to(c,fVar18,fVar19);
LAB_001601cc:
    bVar4 = false;
    break;
  case 0x18:
    if ((int)uVar13 < 8) {
      return 0;
    }
    for (uVar11 = 5; uVar11 < uVar13 - 2; uVar11 = uVar11 + 6) {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar11 - 1],afStack_1d8[uVar11],afStack_1d8[uVar11 + 1],s[uVar11 - 2]
                 ,s[uVar11 - 1],s[uVar11]);
    }
    if ((int)uVar13 <= (int)uVar11 + -4) {
      return 0;
    }
    stbtt__csctx_rline_to(c,afStack_1d8[uVar11 - 1],afStack_1d8[uVar11]);
    break;
  case 0x19:
    if ((int)uVar13 < 8) {
      return 0;
    }
    for (uVar11 = 2; uVar11 - 1 < (ulong)(uVar13 - 6); uVar11 = uVar11 + 2) {
      stbtt__csctx_rline_to(c,s[uVar11 - 2],s[uVar11 - 1]);
    }
    if ((int)uVar13 <= (int)(uVar11 + 3)) {
      return 0;
    }
    fVar19 = s[uVar11 - 2];
    fVar20 = s[uVar11 - 1];
    fVar21 = s[(int)uVar11 + 1];
    dy3 = s[uVar11 + 3 & 0xffffffff];
    dx2 = s[uVar11 & 0xffffffff];
    fVar18 = s[(int)uVar11 + 2];
LAB_00160175:
    stbtt__csctx_rccurve_to(c,fVar19,fVar20,dx2,fVar21,fVar18,dy3);
    break;
  case 0x1a:
  case 0x1b:
    if ((int)uVar13 < 4) {
      return 0;
    }
    fVar18 = 0.0;
    if ((uVar15 & 1) != 0) {
      fVar18 = s[0];
    }
    for (uVar11 = (ulong)(uVar13 & 1) + 3; uVar11 < uVar15; uVar11 = uVar11 + 4) {
      fVar19 = afStack_1d8[uVar11 + 1];
      if (bVar1 == 0x1b) {
        fVar21 = fVar19;
        fVar19 = fVar18;
        fVar18 = 0.0;
        fVar20 = s[uVar11];
      }
      else {
        fVar20 = 0.0;
        fVar21 = fVar18;
        fVar18 = s[uVar11];
      }
      stbtt__csctx_rccurve_to(c,fVar21,fVar19,s[uVar11 - 2],s[uVar11 - 1],fVar20,fVar18);
      fVar18 = 0.0;
    }
    break;
  case 0x1e:
    iVar17 = 0;
    if ((int)uVar13 < 4) {
      return 0;
    }
    while (iVar17 + 3 < (int)uVar13) {
      iVar16 = iVar17 + 4;
      fVar18 = 0.0;
      if (uVar13 - iVar17 == 5) {
        fVar18 = s[iVar16];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar17],s[(long)iVar17 + 1],s[(long)iVar17 + 2],s[iVar17 + 3],fVar18);
LAB_0016072b:
      if ((int)uVar13 <= iVar16 + 3) break;
      iVar17 = iVar16 + 4;
      fVar18 = 0.0;
      if (uVar13 - iVar16 == 5) {
        fVar18 = s[iVar17];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar16],0.0,s[(long)iVar16 + 1],s[(long)iVar16 + 2],fVar18,s[iVar16 + 3]);
    }
    break;
  case 0x1f:
    iVar16 = 0;
    if (3 < (int)uVar13) goto LAB_0016072b;
    return 0;
  default:
    if (bVar1 != 0xff) goto switchD_0015fce3_caseD_2;
LAB_0015fdd6:
    sVar6 = stbtt__buf_get(&local_238,4);
    fVar18 = (float)(int)sVar6 * 1.5258789e-05;
    goto LAB_0015fdef;
  }
  uVar15 = 0;
LAB_001601d7:
  uVar14 = (ulong)(uint)local_238.cursor;
  uVar11 = (ulong)(uint)local_238.size;
  goto LAB_0015fca4;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254))
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}